

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_tree.cc
# Opt level: O3

void __thiscall sparse_tree::sparse_tree(sparse_tree *this,string *structure,int n)

{
  pointer pNVar1;
  void *pvVar2;
  pointer piVar3;
  pointer pcVar4;
  pointer piVar5;
  size_type __new_size;
  size_type __new_size_00;
  string local_90;
  undefined1 local_70 [8];
  pointer local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  memset(this,0,0xa8);
  (this->structure)._M_dataplus._M_p = (pointer)&(this->structure).field_2;
  (this->structure)._M_string_length = 0;
  (this->structure).field_2._M_local_buf[0] = '\0';
  (this->sparse_table).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sparse_table).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sparse_table).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->n = (uint16_t)n;
  std::__cxx11::string::_M_assign((string *)&this->structure);
  __new_size_00 = (size_type)(n + 1);
  local_70 = (undefined1  [8])0x0;
  local_68 = (pointer)0xfffffffeffffffff;
  local_60 = (undefined1  [16])0x0;
  local_50 = (undefined1  [16])0x0;
  local_40 = (undefined1  [16])0x0;
  std::vector<Node,_std::allocator<Node>_>::resize(&this->tree,__new_size_00,(value_type *)local_70)
  ;
  if ((pointer)local_50._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_50._8_8_,local_40._8_8_ - local_50._8_8_);
  }
  if ((pointer)local_60._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_60._0_8_,local_50._0_8_ - local_60._0_8_);
  }
  pNVar1 = (this->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar1->parent = (Node *)0x0;
  pNVar1->index = 0;
  pNVar1->pair = -2;
  pvVar2 = *(void **)&(pNVar1->bases).super__Vector_base<int,_std::allocator<int>_>._M_impl;
  piVar3 = *(pointer *)((long)&(pNVar1->bases).super__Vector_base<int,_std::allocator<int>_> + 0x10)
  ;
  *(undefined1 (*) [16])&(pNVar1->bases).super__Vector_base<int,_std::allocator<int>_>._M_impl =
       (undefined1  [16])0x0;
  *(pointer *)((long)&(pNVar1->bases).super__Vector_base<int,_std::allocator<int>_> + 0x10) =
       (pointer)0x0;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)piVar3 - (long)pvVar2);
  }
  pvVar2 = *(void **)&(pNVar1->children).super__Vector_base<int,_std::allocator<int>_>._M_impl;
  piVar3 = *(pointer *)
            ((long)&(pNVar1->children).super__Vector_base<int,_std::allocator<int>_> + 0x10);
  *(undefined1 (*) [16])&(pNVar1->children).super__Vector_base<int,_std::allocator<int>_>._M_impl =
       (undefined1  [16])0x0;
  *(pointer *)((long)&(pNVar1->children).super__Vector_base<int,_std::allocator<int>_> + 0x10) =
       (pointer)0x0;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)piVar3 - (long)pvVar2);
  }
  __new_size = (size_type)((n + 1) * 2);
  local_70._0_4_ = -1;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->FAI,__new_size,(value_type_conflict *)local_70);
  local_70._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->level,__new_size_00,(value_type_conflict *)local_70);
  std::vector<int,_std::allocator<int>_>::resize(&this->up,__new_size_00);
  std::vector<int,_std::allocator<int>_>::resize(&this->logn,__new_size);
  pcVar4 = (structure->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,pcVar4 + structure->_M_string_length);
  create_tree(this,n,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  preprocess(this);
  this->ptr = 0;
  dfs(this,0,-1,0);
  makeArr(this);
  piVar3 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  piVar3 = (this->euler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->euler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_70 = (undefined1  [8])operator_new(0x38);
  local_68 = (pointer)&(((Node *)local_70)->children).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_60._0_8_ = local_68;
  *(undefined4 *)
   &(((Node *)local_70)->bases).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0xffffffff;
  *(undefined4 *)
   ((long)&(((Node *)local_70)->bases).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0xffffffff;
  *(undefined4 *)
   &(((Node *)local_70)->children).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = 0xffffffff;
  *(undefined4 *)
   ((long)&(((Node *)local_70)->children).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0xffffffff;
  *(undefined4 *)
   &(((Node *)local_70)->bases).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = 0xffffffff;
  *(undefined4 *)
   ((long)&(((Node *)local_70)->bases).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0xffffffff;
  *(undefined4 *)
   &(((Node *)local_70)->bases).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = 0xffffffff;
  *(undefined4 *)
   ((long)&(((Node *)local_70)->bases).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0xffffffff;
  *(undefined4 *)&((Node *)local_70)->parent = 0xffffffff;
  *(undefined4 *)((long)&((Node *)local_70)->parent + 4) = 0xffffffff;
  ((Node *)local_70)->index = -1;
  ((Node *)local_70)->pair = -1;
  (((Node *)local_70)->children).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xffffffffffffffff;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->sparse_table,(long)piVar5 - (long)piVar3 >> 2,(value_type *)local_70);
  if (local_70 != (undefined1  [8])0x0) {
    operator_delete((void *)local_70,local_60._0_8_ - (long)local_70);
  }
  buildSparseTable(this,(int)((ulong)((long)(this->euler).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish -
                                     (long)(this->euler).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start) >> 2));
  return;
}

Assistant:

sparse_tree::sparse_tree(std::string structure,int n){
    this->n = n;
    this->structure = structure;
    tree.resize(n+1,Node());
    tree[0] = Node(0);
    FAI.resize(2*(n+1),-1);
    level.resize((n+1),-1);
    up.resize(n+1);
    logn.resize(2*(n+1));
    create_tree(n,structure);
    preprocess();
    ptr = 0;

    int cur = 1;
    dfs(0,-1,0);
    // depthArr.resize(euler.size());
    makeArr();
    level.clear();
    sparse_table.resize(euler.size(),std::vector<int>(maxSize,-1));
    buildSparseTable(euler.size());
}